

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

int xp_compute_pk(CHAR_DATA *ch,CHAR_DATA *victim,int members)

{
  float fVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *astr;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 local_38 [16];
  
  bVar4 = is_npc(ch);
  if (bVar4) {
    return 0;
  }
  bVar4 = is_npc(victim);
  if (bVar4) {
    return 0;
  }
  astr = ch->pcdata->recentkills[0];
  if (astr != (char *)0x0) {
    uVar8 = 0;
    do {
      bVar4 = false;
      if ((0x5e < uVar8) || (bVar4 = false, *astr == '\0')) goto LAB_0029a045;
      bVar4 = str_cmp(astr,victim->name);
      if (!bVar4) {
        bVar4 = true;
        goto LAB_0029a045;
      }
      astr = ch->pcdata->recentkills[uVar8 + 1];
      uVar8 = uVar8 + 1;
    } while (astr != (char *)0x0);
  }
  bVar4 = false;
LAB_0029a045:
  sVar2 = victim->level;
  iVar6 = (int)sVar2;
  fVar10 = 0.0;
  if (0xe < iVar6) {
    if (sVar2 < 0x14) {
      fVar10 = (float)iVar6;
    }
    else {
      if (sVar2 < 0x19) {
        iVar7 = iVar6 * 2;
      }
      else if (sVar2 < 0x1e) {
        iVar7 = iVar6 * 4;
      }
      else if (sVar2 < 0x23) {
        iVar7 = iVar6 * 8;
      }
      else if (sVar2 < 0x28) {
        iVar7 = iVar6 * 0xc;
      }
      else if (sVar2 < 0x2d) {
        iVar7 = iVar6 << 4;
      }
      else {
        iVar7 = iVar6 * 0x14;
      }
      fVar10 = (float)iVar7;
    }
  }
  auVar11._0_8_ = (double)(iVar6 - ch->level) * 0.05;
  auVar11._8_8_ = in_XMM1_Qb;
  local_38._4_12_ = auVar11._4_12_;
  local_38._0_4_ = ((float)auVar11._0_8_ + 1.0) * fVar10;
  bVar5 = is_good(ch);
  if (bVar5) {
    bVar5 = is_good(victim);
    if (bVar5) {
      send_to_char("With the final strike, you feel a twinge in your soul.\n\r",ch);
      local_38 = ZEXT816(0);
    }
    bVar5 = is_neutral(victim);
    if (bVar5) {
      local_38._0_4_ = (float)local_38._0_4_ * 0.5;
    }
    bVar5 = is_evil(victim);
    if (bVar5) {
      local_38._0_4_ = (float)local_38._0_4_ * 1.25;
    }
    local_38._0_4_ = (float)local_38._0_4_ + (float)(victim->pcdata->kills[1] * 5);
  }
  bVar5 = is_neutral(ch);
  if (bVar5) {
    bVar5 = is_good(victim);
    if (bVar5) {
      sVar2 = ch->pcdata->kills[1];
      sVar3 = ch->pcdata->kills[3];
      if (sVar2 < sVar3) {
        local_38._8_4_ = 0;
        local_38._12_4_ = 0;
        local_38._0_4_ = (float)local_38._0_4_ * 1.2;
      }
      else {
      }
      if (sVar3 < sVar2) {
        local_38._0_4_ = (float)local_38._0_4_ * 0.8;
      }
      local_38._4_4_ = 0;
    }
    bVar5 = is_evil(victim);
    if (bVar5) {
      sVar2 = ch->pcdata->kills[1];
      sVar3 = ch->pcdata->kills[3];
      if (sVar3 < sVar2) {
        local_38._0_4_ = (float)local_38._0_4_ * 1.2;
      }
      if (sVar2 < sVar3) {
        local_38._0_4_ = (float)local_38._0_4_ * 0.8;
      }
      goto LAB_0029a22d;
    }
  }
LAB_0029a22d:
  if ((ch->cabal != 0) && (victim->cabal == 0)) {
    local_38._0_4_ = (float)local_38._0_4_ * 0.8;
  }
  if ((ch->cabal == 0) && (victim->cabal != 0)) {
    local_38._0_4_ = (float)local_38._0_4_ * 1.2;
  }
  if (bVar4) {
    send_to_char("You have little more to learn from slaying this foe repeatedly.\n\r",ch);
    fVar10 = 0.0;
  }
  else {
    fVar10 = victim->pcdata->frags[0];
    fVar1 = victim->pcdata->fragged;
    fVar12 = fVar10 + fVar1;
    uVar9 = -(uint)(5.0 < fVar12);
    fVar10 = (float)(~uVar9 & local_38._0_4_ |
                    (uint)(((fVar10 - fVar1) / fVar12 + 1.0) * (float)local_38._0_4_) & uVar9) /
             ((float)members * (float)members);
  }
  return (int)fVar10;
}

Assistant:

int xp_compute_pk(CHAR_DATA *ch, CHAR_DATA *victim, int members)
{
	int i;
	float xp, netpk, totalpk;
	bool recentpk = false;

	if (is_npc(ch) || is_npc(victim))
		return 0;

	for (i = 0; ch->pcdata->recentkills[i] && *(ch->pcdata->recentkills[i]) != '\0' && i < 95; i++)
	{
		if (!str_cmp(ch->pcdata->recentkills[i], victim->name))
		{
			recentpk = true;
			break;
		}
	}

	/* We don't want to encourage low-level PKing */

	if (victim->level < 15)
		xp = 0;
	else if (victim->level < 20)
		xp = victim->level;
	else if (victim->level < 25)
		xp = victim->level * 2;
	else if (victim->level < 30)
		xp = victim->level * 4;
	else if (victim->level < 35)
		xp = victim->level * 8;
	else if (victim->level < 40)
		xp = victim->level * 12;
	else if (victim->level < 45)
		xp = victim->level * 16;
	else
		xp = victim->level * 20;

	/* Level mods */

	xp *= (float)(1 + (float)(0.05 * (victim->level - ch->level)));

	/* Alignment mods */

	if (is_good(ch))
	{
		if (is_good(victim))
		{
			send_to_char("With the final strike, you feel a twinge in your soul.\n\r", ch);
			xp = 0;
		}

		if (is_neutral(victim))
			xp /= 2;

		if (is_evil(victim))
			xp *= 1.25;

		xp += 5 * victim->pcdata->kills[PK_GOOD];
	}

	if (is_neutral(ch))
	{
		if (is_good(victim))
		{
			if (ch->pcdata->kills[PK_GOOD] < ch->pcdata->kills[PK_EVIL])
				xp *= 1.2;

			if (ch->pcdata->kills[PK_GOOD] > ch->pcdata->kills[PK_EVIL])
				xp *= 0.8;
		}

		if (is_evil(victim))
		{
			if (ch->pcdata->kills[PK_GOOD] > ch->pcdata->kills[PK_EVIL])
				xp *= 1.2;

			if (ch->pcdata->kills[PK_GOOD] < ch->pcdata->kills[PK_EVIL])
				xp *= 0.8;
		}
	}

	/* Cabal mods */

	if (ch->cabal && !victim->cabal)
		xp *= 0.8;

	if (!ch->cabal && victim->cabal)
		xp *= 1.2;

	/* Victim PK mods */

	netpk = victim->pcdata->frags[PK_KILLS] - victim->pcdata->fragged;
	totalpk = victim->pcdata->frags[PK_KILLS] + victim->pcdata->fragged;

	if (totalpk > 5)
		xp *= (1 + (netpk / totalpk));

	/* We do not reward gangbanging */

	xp /= pow(members, 2);

	/* We do not reward multikilling */

	if (recentpk)
	{
		xp = 0;
		send_to_char("You have little more to learn from slaying this foe repeatedly.\n\r", ch);
	}

	return (int)xp;
}